

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseRow(TidyDocImpl *doc,Node *row,GetTokenMode mode)

{
  int iVar1;
  Lexer *pLVar2;
  TidyParserMemory *pTVar3;
  TidyParserMemory data;
  Bool BVar4;
  uint uVar5;
  TidyTagId TVar6;
  long lVar7;
  Node *node;
  Dict *pDVar8;
  uint code;
  Node **ppNVar9;
  TidyTagId TVar10;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *pNVar11;
  Bool BVar12;
  int iVar13;
  TidyDocImpl *local_68;
  long lStack_48;
  long lStack_40;
  
  pLVar2 = doc->lexer;
  if (row == (Node *)0x0) {
    iVar1 = (doc->stack).top;
    lVar7 = (long)iVar1;
    if (-1 < lVar7) {
      pTVar3 = (doc->stack).content;
      local_68 = (TidyDocImpl *)pTVar3[lVar7].original_node;
      iVar13 = pTVar3[lVar7].reentry_state;
      BVar12 = pTVar3[lVar7].register_1;
      (doc->stack).top = iVar1 + -1;
      goto switchD_0013ea25_default;
    }
    local_68 = (TidyDocImpl *)0x0;
  }
  else {
    local_68 = (TidyDocImpl *)row;
    if ((row->tag->model & 1) != 0) {
LAB_0013ed35:
      return (Node *)0x0;
    }
  }
  BVar12 = no;
  iVar13 = 0;
switchD_0013ea25_default:
  do {
    switch(iVar13) {
    case 0:
      node = prvTidyGetToken(doc,IgnoreWhitespace);
      iVar13 = 3;
      if (node != (Node *)0x0) {
        if (node->tag == (local_68->root).tag) {
          if (node->type == EndTag) {
            prvTidyFreeNode(doc,node);
            (local_68->root).closed = yes;
          }
          else {
            prvTidyUngetToken(doc);
          }
          FixEmptyRow(doc,&local_68->root);
          return (Node *)0x0;
        }
        if (node->type == EndTag) {
          BVar4 = prvTidynodeHasCM(node,0x82);
          pDVar8 = node->tag;
          if (BVar4 == no) {
            if (pDVar8 != (Dict *)0x0) {
              TVar10 = pDVar8->id;
              TVar6 = TidyTag_TABLE;
              if (TVar10 == TidyTag_TABLE) goto LAB_0013eade;
              goto LAB_0013eb03;
            }
LAB_0013eb08:
            BVar4 = prvTidynodeHasCM(node,0x18);
            pDVar8 = node->tag;
            if (BVar4 == no) {
              if ((pDVar8 == (Dict *)0x0) ||
                 ((pDVar8->id != TidyTag_TH && (pDVar8->id != TidyTag_TD)))) goto LAB_0013eb4a;
            }
            else if (pDVar8 != (Dict *)0x0) goto LAB_0013eb22;
          }
          else {
            if (pDVar8 == (Dict *)0x0) {
              pDVar8 = (Dict *)0x0;
              TVar6 = TidyTag_UNKNOWN;
            }
            else {
              TVar6 = pDVar8->id;
            }
LAB_0013eade:
            for (pNVar11 = (local_68->root).parent; pNVar11 != (Node *)0x0;
                pNVar11 = pNVar11->parent) {
              if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->id == TVar6)) goto LAB_0013ecfe;
            }
            if (pDVar8 == (Dict *)0x0) goto LAB_0013eb08;
            TVar10 = pDVar8->id;
LAB_0013eb03:
            if (TVar10 != TidyTag_FORM) goto LAB_0013eb08;
LAB_0013eb22:
            if (pDVar8->id == TidyTag_FORM) {
              *(byte *)&doc->badForm = (byte)doc->badForm | 1;
            }
          }
LAB_0013eb9e:
          code = 0x235;
        }
        else {
LAB_0013eb4a:
          BVar4 = InsertMisc(&local_68->root,node);
          iVar13 = 0;
          if (BVar4 != no) break;
          if (node->tag == (Dict *)0x0) {
            if (node->type == TextNode) goto LAB_0013eb77;
            goto LAB_0013eb9e;
          }
          if (node->tag->id == TidyTag_TABLE) goto LAB_0013eb9e;
LAB_0013eb77:
          BVar4 = prvTidynodeHasCM(node,0x100);
          if (BVar4 != no) {
LAB_0013ecfe:
            prvTidyUngetToken(doc);
            return (Node *)0x0;
          }
          if (node->type == EndTag) goto LAB_0013eb9e;
          if ((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_FORM)) {
            BVar4 = prvTidynodeIsText(node);
            pNVar11 = extraout_RDX;
            if ((BVar4 != no) ||
               (BVar4 = prvTidynodeHasCM(node,0x18), pNVar11 = extraout_RDX_00, BVar4 != no)) {
              MoveBeforeTable(local_68,node,pNVar11);
              prvTidyReport(doc,&local_68->root,node,0x27e);
              BVar12 = pLVar2->excludeBlocks;
              pLVar2->excludeBlocks = no;
              pLVar2->exiled = yes;
              if (node->type != TextNode) {
                lStack_48 = 1;
                goto LAB_0013edf3;
              }
              pLVar2->exiled = no;
              pLVar2->excludeBlocks = BVar12;
              break;
            }
            pDVar8 = node->tag;
            if ((pDVar8->model & 4) != 0) {
              iVar13 = 0;
              prvTidyReport(doc,&local_68->root,node,0x27e);
              MoveToHead(doc,&local_68->root,node);
              break;
            }
LAB_0013eca0:
            if ((pDVar8->id == TidyTag_TH) || (pDVar8->id == TidyTag_TD)) {
              node->parent = &local_68->root;
              if (local_68 == (TidyDocImpl *)0x0) {
                node->prev = (Node *)0x0;
              }
              else {
                pNVar11 = (local_68->root).last;
                node->prev = pNVar11;
                ppNVar9 = &pNVar11->next;
                if (pNVar11 == (Node *)0x0) {
                  ppNVar9 = &(local_68->root).content;
                }
                *ppNVar9 = node;
                (local_68->root).last = node;
              }
              BVar12 = pLVar2->excludeBlocks;
              pLVar2->excludeBlocks = no;
              lStack_48 = 2;
LAB_0013edf3:
              lStack_40 = (ulong)BVar12 << 0x20;
              lStack_48 = lStack_48 << 0x20;
              data.original_node = &local_68->root;
              data.identity = prvTidyParseRow;
              data.reentry_node = node;
              data.reentry_mode = (undefined4)lStack_48;
              data.reentry_state = lStack_48._4_4_;
              data.mode = (undefined4)lStack_40;
              data.register_1 = lStack_40._4_4_;
              data._40_8_ = 0;
              prvTidypushMemory(doc,data);
              return node;
            }
          }
          else {
            prvTidyUngetToken(doc);
            node = prvTidyInferredTag(doc,TidyTag_TD);
            prvTidyReport(doc,&local_68->root,node,0x261);
            if (node == (Node *)0x0) {
              node = (Node *)0x0;
            }
            else {
              pDVar8 = node->tag;
              if (pDVar8 != (Dict *)0x0) goto LAB_0013eca0;
            }
          }
          code = 0x27e;
        }
        iVar13 = 0;
        prvTidyReport(doc,&local_68->root,node,code);
        prvTidyFreeNode(doc,node);
      }
      break;
    case 1:
      pLVar2->exiled = no;
      pLVar2->excludeBlocks = BVar12;
      iVar13 = 0;
      break;
    case 2:
      pLVar2->excludeBlocks = BVar12;
      uVar5 = pLVar2->istacksize;
      while (iVar13 = 0, pLVar2->istackbase < uVar5) {
        prvTidyPopInline(doc,(Node *)0x0);
        uVar5 = pLVar2->istacksize;
      }
      break;
    case 3:
      goto LAB_0013ed35;
    }
  } while( true );
}

Assistant:

Node* TY_(ParseRow)( TidyDocImpl* doc, Node *row, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool exclude_state = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NOT_ENDTAG,        /* To-do after re-entering after !EndTag checks. */
        STATE_POST_TD_TH,             /* To-do after re-entering after TD/TH checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    if ( row == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        row = memory.original_node;
        state = memory.reentry_state;
        exclude_state = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(row);

        if (row->tag->model & CM_EMPTY)
            return NULL;
    }

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)( doc, IgnoreWhitespace );
            DEBUG_LOG_GOT_TOKEN(node);
        }
    
        switch (state)
        {
            case STATE_INITIAL:
            {
                if ( node == NULL)
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if (node->tag == row->tag)
                {
                    if (node->type == EndTag)
                    {
                        TY_(FreeNode)( doc, node);
                        row->closed = yes;
                        FixEmptyRow( doc, row);
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    /* New row start implies end of current row */
                    TY_(UngetToken)( doc );
                    FixEmptyRow( doc, row);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                /*
                  if this is the end tag for an ancestor element
                  then infer end tag for this element
                */
                if ( node->type == EndTag )
                {
                    if ( (TY_(nodeHasCM)(node, CM_HTML|CM_TABLE) || nodeIsTABLE(node))
                         && DescendantOf(row, TagId(node)) )
                    {
                        TY_(UngetToken)( doc );
                        DEBUG_LOG_EXIT;
                        return NULL;
                    }

                    if ( nodeIsFORM(node) || TY_(nodeHasCM)(node, CM_BLOCK|CM_INLINE) )
                    {
                        if ( nodeIsFORM(node) )
                            BadForm( doc );

                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }

                    if ( nodeIsTD(node) || nodeIsTH(node) )
                    {
                        TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);
                        continue;
                    }
                }

                /* deal with comments etc. */
                if (InsertMisc(row, node))
                    continue;

                /* discard unknown tags */
                if (node->tag == NULL && node->type != TextNode)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* discard unexpected <table> element */
                if ( nodeIsTABLE(node) )
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* THEAD, TFOOT or TBODY */
                if ( TY_(nodeHasCM)(node, CM_ROWGRP) )
                {
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if (node->type == EndTag)
                {
                    TY_(Report)(doc, row, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /*
                  if text or inline or block move before table
                  if head content move to head
                */

                if (node->type != EndTag)
                {
                    if ( nodeIsFORM(node) )
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_TD);
                        TY_(Report)(doc, row, node, MISSING_STARTTAG);
                    }
                    else if ( TY_(nodeIsText)(node)
                              || TY_(nodeHasCM)(node, CM_BLOCK | CM_INLINE) )
                    {
                        MoveBeforeTable( doc, row, node );
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        lexer->exiled = yes;
                        exclude_state = lexer->excludeBlocks;
                        lexer->excludeBlocks = no;

                        if (node->type != TextNode)
                        {
                            TidyParserMemory memory = {0};
                            memory.identity = TY_(ParseRow);
                            memory.original_node = row;
                            memory.reentry_node = node;
                            memory.reentry_state = STATE_POST_NOT_ENDTAG;
                            memory.register_1 = exclude_state;
                            TY_(pushMemory)( doc, memory );
                            DEBUG_LOG_EXIT_WITH_NODE(node);
                            return node;
                        }
                        
                        lexer->exiled = no;
                        lexer->excludeBlocks = exclude_state;
                        continue;
                    }
                    else if (node->tag->model & CM_HEAD)
                    {
                        TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                        MoveToHead( doc, row, node);
                        continue;
                    }
                }

                if ( !(nodeIsTD(node) || nodeIsTH(node)) )
                {
                    TY_(Report)(doc, row, node, TAG_NOT_ALLOWED_IN);
                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* node should be <TD> or <TH> */
                TY_(InsertNodeAtEnd)(row, node);
                exclude_state = lexer->excludeBlocks;
                lexer->excludeBlocks = no;
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseRow);
                    memory.original_node = row;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_TD_TH;
                    memory.register_1 = exclude_state;
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }
            } break;
                
                
            case STATE_POST_NOT_ENDTAG:
            {
                lexer->exiled = no;
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            case STATE_POST_TD_TH:
            {
                lexer->excludeBlocks = exclude_state; /* capture this in stack. */

                /* pop inline stack */
                while ( lexer->istacksize > lexer->istackbase )
                    TY_(PopInline)( doc, NULL );
                
                state = STATE_INITIAL;
                continue;
            } break;
                
                
            default:
                break;
                
        } /* switch */
    } /* while */
    DEBUG_LOG_EXIT;
    return NULL;
}